

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::FindPrevUserEntry(DBIter *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  size_type __n;
  size_type extraout_RDX;
  ValueType VVar6;
  long in_FS_OFFSET;
  Slice SVar7;
  ParsedInternalKey ikey;
  string empty;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->direction_ != kReverse) {
    __assert_fail("direction_ == kReverse",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0xed,"void leveldb::(anonymous namespace)::DBIter::FindPrevUserEntry()");
  }
  iVar3 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar3 != '\0') {
    VVar6 = kTypeDeletion;
    do {
      ikey.user_key.data_ = "";
      ikey.user_key.size_ = 0;
      bVar2 = ParseKey(this,&ikey);
      if ((bVar2) && (ikey.sequence <= this->sequence_)) {
        if (VVar6 != kTypeDeletion) {
          empty._M_dataplus._M_p = (this->saved_key_)._M_dataplus._M_p;
          empty._M_string_length = (this->saved_key_)._M_string_length;
          iVar3 = (*this->user_comparator_->_vptr_Comparator[2])
                            (this->user_comparator_,&ikey,&empty);
          if (iVar3 < 0) goto LAB_00a3565b;
        }
        VVar6 = ikey.type;
        if (ikey.type == kTypeDeletion) {
          (this->saved_key_)._M_string_length = 0;
          *(this->saved_key_)._M_dataplus._M_p = '\0';
          ClearSavedValue(this);
          VVar6 = kTypeDeletion;
        }
        else {
          iVar3 = (*this->iter_->_vptr_Iterator[9])();
          uVar5 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this->saved_value_)._M_dataplus._M_p != &(this->saved_value_).field_2) {
            uVar5 = (this->saved_value_).field_2._M_allocated_capacity;
          }
          if (__n + 0x100000 < uVar5) {
            empty._M_dataplus._M_p = (pointer)&empty.field_2;
            empty._M_string_length = 0;
            empty.field_2._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                      (&empty,&this->saved_value_);
            std::__cxx11::string::~string((string *)&empty);
          }
          iVar4 = (*this->iter_->_vptr_Iterator[8])();
          empty._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar4);
          empty._M_string_length = extraout_RDX;
          SVar7 = ExtractUserKey((Slice *)&empty);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&this->saved_key_,SVar7.data_,SVar7.size_);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&this->saved_value_,(char *)CONCAT44(extraout_var,iVar3),__n);
        }
      }
      (*this->iter_->_vptr_Iterator[7])();
      iVar3 = (*this->iter_->_vptr_Iterator[2])();
    } while ((char)iVar3 != '\0');
    if (VVar6 != kTypeDeletion) {
LAB_00a3565b:
      this->valid_ = true;
      goto LAB_00a35686;
    }
  }
  this->valid_ = false;
  (this->saved_key_)._M_string_length = 0;
  *(this->saved_key_)._M_dataplus._M_p = '\0';
  ClearSavedValue(this);
  this->direction_ = kForward;
LAB_00a35686:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::FindPrevUserEntry() {
  assert(direction_ == kReverse);

  ValueType value_type = kTypeDeletion;
  if (iter_->Valid()) {
    do {
      ParsedInternalKey ikey;
      if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
        if ((value_type != kTypeDeletion) &&
            user_comparator_->Compare(ikey.user_key, saved_key_) < 0) {
          // We encountered a non-deleted value in entries for previous keys,
          break;
        }
        value_type = ikey.type;
        if (value_type == kTypeDeletion) {
          saved_key_.clear();
          ClearSavedValue();
        } else {
          Slice raw_value = iter_->value();
          if (saved_value_.capacity() > raw_value.size() + 1048576) {
            std::string empty;
            swap(empty, saved_value_);
          }
          SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
          saved_value_.assign(raw_value.data(), raw_value.size());
        }
      }
      iter_->Prev();
    } while (iter_->Valid());
  }

  if (value_type == kTypeDeletion) {
    // End
    valid_ = false;
    saved_key_.clear();
    ClearSavedValue();
    direction_ = kForward;
  } else {
    valid_ = true;
  }
}